

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a4_aux.c
# Opt level: O2

void polygon(int vertices,int *points,ALLEGRO_COLOR color)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  float in_XMM2_Db;
  undefined8 local_128;
  undefined8 local_120;
  undefined4 local_118;
  ALLEGRO_COLOR local_114;
  undefined4 local_104;
  undefined4 uStack_100;
  undefined4 uStack_fc;
  undefined4 uStack_f8;
  undefined1 local_f4 [8];
  undefined8 uStack_ec;
  undefined4 local_e4;
  
  local_120 = 0;
  local_118 = 0;
  uVar3 = 0;
  uVar2 = 0;
  if (0 < vertices) {
    uVar2 = (ulong)(uint)vertices;
  }
  auVar6 = ZEXT816(0);
  for (; uVar2 != uVar3; uVar3 = uVar3 + 1) {
    in_XMM2_Db = (float)(int)((ulong)*(undefined8 *)(points + uVar3 * 2) >> 0x20);
    auVar5._0_4_ = auVar6._0_4_ + (float)(int)*(undefined8 *)(points + uVar3 * 2);
    auVar5._4_4_ = auVar6._4_4_ + in_XMM2_Db;
    auVar5._8_4_ = auVar6._8_4_ + 0.0;
    auVar5._12_4_ = auVar6._12_4_ + 0.0;
    auVar6 = auVar5;
  }
  auVar1._4_4_ = (float)vertices;
  auVar1._0_4_ = (float)vertices;
  auVar1._8_4_ = in_XMM2_Db;
  auVar1._12_4_ = in_XMM2_Db;
  auVar6 = divps(auVar6,auVar1);
  local_128 = auVar6._0_8_;
  for (lVar4 = 0; uVar2 * 0x24 - lVar4 != 0; lVar4 = lVar4 + 0x24) {
    *(ulong *)((long)&local_104 + lVar4) =
         CONCAT44((float)(int)((ulong)*(undefined8 *)points >> 0x20),
                  (float)(int)*(undefined8 *)points);
    *(undefined8 *)((long)&uStack_fc + lVar4) = 0;
    *(ALLEGRO_COLOR *)(local_f4 + lVar4 + 4) = color;
    *(undefined4 *)(local_f4 + lVar4) = 0;
    points = points + 2;
  }
  lVar4 = (long)(vertices + 1) * 0x24;
  *(undefined4 *)((long)&local_114 + lVar4 + 0xc) = local_e4;
  local_114 = color;
  *(undefined1 (*) [8])(&local_118 + (long)(vertices + 1) * 9) = local_f4;
  *(undefined8 *)((long)&local_114 + lVar4 + 4) = uStack_ec;
  *(undefined4 *)((long)&local_128 + lVar4) = local_104;
  *(undefined4 *)((long)&local_128 + lVar4 + 4) = uStack_100;
  *(undefined4 *)((long)&local_120 + lVar4) = uStack_fc;
  *(undefined4 *)((long)&local_120 + lVar4 + 4) = uStack_f8;
  al_draw_prim(&local_128,0,0,0,vertices + 2,5);
  return;
}

Assistant:

void polygon(int vertices, const int *points, ALLEGRO_COLOR color)
{
   ALLEGRO_VERTEX vtxs[MAX_POLYGON_VERTICES + 2];
   int i;

   assert(vertices <= MAX_POLYGON_VERTICES);

   vtxs[0].x = 0.0;
   vtxs[0].y = 0.0;
   vtxs[0].z = 0.0;
   vtxs[0].color = color;
   vtxs[0].u = 0;
   vtxs[0].v = 0;

   for (i = 0; i < vertices; i++) {
      vtxs[0].x += points[i*2];
      vtxs[0].y += points[i*2 + 1];
   }

   vtxs[0].x /= vertices;
   vtxs[0].y /= vertices;

   for (i = 1; i <= vertices; i++) {
      vtxs[i].x = points[0];
      vtxs[i].y = points[1];
      vtxs[i].z = 0.0;
      vtxs[i].color = color;
      vtxs[i].u = 0;
      vtxs[i].v = 0;
      points += 2;
   }

   vtxs[vertices + 1] = vtxs[1];

   al_draw_prim(vtxs, NULL, NULL, 0, vertices + 2, ALLEGRO_PRIM_TRIANGLE_FAN);
}